

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-dynamical-system.cpp
# Opt level: O0

Vector __thiscall
stateObservation::IMUDynamicalSystem::stateDynamics
          (IMUDynamicalSystem *this,Vector *x,Vector *u,TimeIndex param_3)

{
  Index *__return_storage_ptr__;
  double *pdVar1;
  Index rows;
  Scalar *scalar;
  StorageBaseType *matrix;
  Index extraout_RDX;
  Vector VVar2;
  Type local_508;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_4d8;
  Type local_4b8;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_488;
  Type local_468;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_438;
  Type local_418;
  Matrix<double,3,1,0,3,1> local_3e8 [8];
  Vector3 angularJerkInput;
  Matrix<double,3,1,0,3,1> local_3a0 [8];
  Vector3 linearJerkInput;
  Type local_358;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_328;
  undefined1 local_300 [8];
  AngleAxis orientationAA;
  Type local_2a0;
  ConstantReturnType local_270;
  undefined1 local_258 [8];
  Vector xk1;
  Quaternion orientation;
  undefined1 local_1f8 [8];
  Vector3 gyroBias;
  undefined1 local_1b0 [8];
  Vector3 angularAcceleration;
  undefined1 local_168 [8];
  Vector3 angularVelocity;
  undefined1 local_120 [8];
  Vector3 orientationV;
  undefined1 local_d8 [8];
  Vector3 acceleration;
  undefined1 local_90 [8];
  Vector3 velocity;
  undefined1 local_48 [8];
  Vector3 position;
  TimeIndex param_3_local;
  Vector *u_local;
  Vector *x_local;
  IMUDynamicalSystem *this_local;
  
  DynamicalSystemFunctorBase::assertStateVector_((DynamicalSystemFunctorBase *)x,u);
  DynamicalSystemFunctorBase::assertInputVector_((DynamicalSystemFunctorBase *)x,(Vector *)param_3);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            ((Type *)(velocity.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array + 2),
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)u,0,3);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
            ((Matrix<double,3,1,0,3,1> *)local_48,
             (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *)
             (velocity.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array + 2));
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            ((Type *)(acceleration.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array + 2),
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)u,6,3);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
            ((Matrix<double,3,1,0,3,1> *)local_90,
             (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *)
             (acceleration.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array + 2));
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            ((Type *)(orientationV.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array + 2),
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)u,0xc,3);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
            ((Matrix<double,3,1,0,3,1> *)local_d8,
             (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *)
             (orientationV.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array + 2));
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            ((Type *)(angularVelocity.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array + 2),
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)u,3,3);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
            ((Matrix<double,3,1,0,3,1> *)local_120,
             (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *)
             (angularVelocity.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
              .m_data.array + 2));
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            ((Type *)(angularAcceleration.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                      array + 2),(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)u,9,3);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
            ((Matrix<double,3,1,0,3,1> *)local_168,
             (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *)
             (angularAcceleration.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array + 2));
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            ((Type *)(gyroBias.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array + 2),
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)u,0xf,3);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
            ((Matrix<double,3,1,0,3,1> *)local_1b0,
             (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *)
             (gyroBias.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)local_1f8);
  if (((ulong)x[0x17].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data & 1) != 0) {
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
              ((Type *)(orientation.m_coeffs.
                        super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                        m_data.array + 3),(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)u,
               0x12,3);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,3,1,0,3,1> *)local_1f8,
               (DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_>
                *)(orientation.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
                   .m_storage.m_data.array + 3));
  }
  __return_storage_ptr__ =
       &xk1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
  computeQuaternion_((Quaternion *)__return_storage_ptr__,(IMUDynamicalSystem *)x,
                     (Vector3 *)local_120);
  kine::integrateKinematics
            ((Vector3 *)local_48,(Vector3 *)local_90,(Vector3 *)local_d8,
             (Quaternion *)__return_storage_ptr__,(Vector3 *)local_168,(Vector3 *)local_1b0,
             (double)x[0x12].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_rows);
  rows = (*(code *)(x->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                   m_data[5])();
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero(&local_270,rows,1);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,_1,1,0,_1,1> *)local_258,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_270);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            (&local_2a0,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_258,0,3);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false> *)&local_2a0,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_48);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            ((Type *)&orientationAA.m_angle,
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_258,6,3);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false> *)&orientationAA.m_angle,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_90);
  Eigen::AngleAxis<double>::AngleAxis<Eigen::Quaternion<double,0>>
            ((AngleAxis<double> *)local_300,
             (QuaternionBase<Eigen::Quaternion<double,_0>_> *)
             &xk1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows);
  scalar = Eigen::AngleAxis<double>::angle((AngleAxis<double> *)local_300);
  matrix = (StorageBaseType *)Eigen::AngleAxis<double>::axis((AngleAxis<double> *)local_300);
  Eigen::operator*(&local_328,scalar,matrix);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,3,1,0,3,1> *)local_120,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_328);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            (&local_358,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_258,3,3);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false> *)&local_358,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_120);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            ((Type *)(linearJerkInput.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array + 2),
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_258,9,3);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false> *)
             (linearJerkInput.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
              .m_data.array + 2),(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_168);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head<3>
            ((Type *)(angularJerkInput.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array + 2),
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)param_3,3);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
            (local_3a0,
             (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *)
             (angularJerkInput.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
              m_storage.m_data.array + 2));
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::tail<3>
            (&local_418,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)param_3,3);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,3,1,false>>
            (local_3e8,
             (EigenBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false>_> *)
             &local_418);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator*
            (&local_438,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_3a0,
             (double *)
             &x[0x12].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            (&local_468,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_258,0xc,3);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>>::operator+=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>> *)&local_468,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)&local_438);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator*
            (&local_488,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_3e8,
             (double *)
             &x[0x12].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
            (&local_4b8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_258,0xf,3);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>>::operator+=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false>> *)&local_4b8,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)&local_488);
  if (((ulong)x[0x17].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
              m_data & 1) != 0) {
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator*
              (&local_4d8,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_1f8,(double *)&one_);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<3>
              (&local_508,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_258,0x12,3);
    Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,3,1,false> *)&local_508,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)&local_4d8);
  }
  if (x[0x12].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data ==
      (double *)0x0) {
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)this,(Matrix<double,__1,_1,_0,__1,_1> *)local_258)
    ;
  }
  else {
    pdVar1 = x[0x12].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
    ;
    (**(code **)((long)*pdVar1 + 0x10))(this,pdVar1,local_258);
  }
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_258);
  VVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       extraout_RDX;
  VVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (Vector)VVar2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Vector IMUDynamicalSystem::stateDynamics(const Vector & x, const Vector & u, TimeIndex)
{
  assertStateVector_(x);
  assertInputVector_(u);

  Vector3 position = x.segment<3>(indexes::pos);
  Vector3 velocity = x.segment<3>(indexes::linVel);
  Vector3 acceleration = x.segment<3>(indexes::linAcc);

  Vector3 orientationV = x.segment<3>(indexes::ori);
  Vector3 angularVelocity = x.segment<3>(indexes::angVel);
  Vector3 angularAcceleration = x.segment<3>(indexes::angAcc);

  Vector3 gyroBias;
  if(withGyroBias_)
  {
    gyroBias = x.segment<3>(indexes::gyroBias);
  }

  Quaternion orientation = computeQuaternion_(orientationV);

  kine::integrateKinematics(position, velocity, acceleration, orientation, angularVelocity, angularAcceleration, dt_);

  // x_{k+1}
  Vector xk1 = Vector::Zero(getStateSize(), 1);

  xk1.segment<3>(indexes::pos) = position;
  xk1.segment<3>(indexes::linVel) = velocity;

  AngleAxis orientationAA(orientation);

  orientationV = orientationAA.angle() * orientationAA.axis();

  xk1.segment<3>(indexes::ori) = orientationV;
  xk1.segment<3>(indexes::angVel) = angularVelocity;

  // inputs
  Vector3 linearJerkInput = u.head<3>();
  Vector3 angularJerkInput = u.tail<3>();

  xk1.segment<3>(indexes::linAcc) += linearJerkInput * dt_;
  xk1.segment<3>(indexes::angAcc) += angularJerkInput * dt_;

  if(withGyroBias_)
  {
    xk1.segment<3>(indexes::gyroBias) = gyroBias * one_;
  }

  if(processNoise_ != 0x0)
    return processNoise_->getNoisy(xk1);
  else
    return xk1;
}